

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_get_rows(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b)

{
  ggml_tensor *pgVar1;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  int64_t in_RDI;
  ggml_tensor *result;
  int64_t in_stack_00000008;
  ggml_type type;
  
  if (in_RSI->ne[2] != in_RDX->ne[1]) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0xcff
               ,"GGML_ASSERT(%s) failed","a->ne[2] == b->ne[1]");
  }
  if (in_RDX->ne[3] != 1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0xd00
               ,"GGML_ASSERT(%s) failed","b->ne[3] == 1");
  }
  if (in_RDX->type != GGML_TYPE_I32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0xd01
               ,"GGML_ASSERT(%s) failed","b->type == GGML_TYPE_I32");
  }
  pgVar1 = ggml_new_tensor_4d(ctx,a._4_4_,(int64_t)b,in_stack_00000008,(int64_t)result,in_RDI);
  pgVar1->op = GGML_OP_GET_ROWS;
  pgVar1->src[0] = in_RSI;
  pgVar1->src[1] = in_RDX;
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_get_rows(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b) {
    GGML_ASSERT(a->ne[2] == b->ne[1]);
    GGML_ASSERT(b->ne[3] == 1);
    GGML_ASSERT(b->type == GGML_TYPE_I32);

    // TODO: implement non F32 return
    enum ggml_type type = GGML_TYPE_F32;
    if (a->type == GGML_TYPE_I32) {
        type = a->type;
    }
    struct ggml_tensor * result = ggml_new_tensor_4d(ctx, type, a->ne[0], b->ne[0], b->ne[1], b->ne[2]);

    result->op     = GGML_OP_GET_ROWS;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}